

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestUnpackedTypes::Clear(TestUnpackedTypes *this)

{
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.unpacked_int32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.unpacked_int64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.unpacked_uint32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.unpacked_uint64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.unpacked_sint32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.unpacked_sint64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.unpacked_fixed32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.unpacked_fixed64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.unpacked_sfixed32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.unpacked_sfixed64_);
  google::protobuf::RepeatedField<float>::Clear(&(this->field_0)._impl_.unpacked_float_);
  google::protobuf::RepeatedField<double>::Clear(&(this->field_0)._impl_.unpacked_double_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.unpacked_bool_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.unpacked_enum_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestUnpackedTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestUnpackedTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.unpacked_int32_.Clear();
  _impl_.unpacked_int64_.Clear();
  _impl_.unpacked_uint32_.Clear();
  _impl_.unpacked_uint64_.Clear();
  _impl_.unpacked_sint32_.Clear();
  _impl_.unpacked_sint64_.Clear();
  _impl_.unpacked_fixed32_.Clear();
  _impl_.unpacked_fixed64_.Clear();
  _impl_.unpacked_sfixed32_.Clear();
  _impl_.unpacked_sfixed64_.Clear();
  _impl_.unpacked_float_.Clear();
  _impl_.unpacked_double_.Clear();
  _impl_.unpacked_bool_.Clear();
  _impl_.unpacked_enum_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}